

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,ForStatement *statement)

{
  undefined1 *puVar1;
  Expression *pEVar2;
  CompoundStatement *pCVar3;
  
  puVar1 = &this->field_0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"for ",4);
  pEVar2 = ForStatement::getE1(statement);
  if (pEVar2 != (Expression *)0x0) {
    pEVar2 = ForStatement::getE1(statement);
    (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,";",1);
  pEVar2 = ForStatement::getE2(statement);
  if (pEVar2 != (Expression *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
    pEVar2 = ForStatement::getE2(statement);
    (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,";",1);
  pEVar2 = ForStatement::getE3(statement);
  if (pEVar2 != (Expression *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ",1);
    pEVar2 = ForStatement::getE3(statement);
    (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,":\n",2);
  this->n_spaces = this->n_spaces + 1;
  pCVar3 = ForStatement::getStatements(statement);
  (**(pCVar3->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar3,this);
  this->n_spaces = this->n_spaces + -1;
  return;
}

Assistant:

void PrettyPrinter::visit(ForStatement* statement) {
    output << "for ";

    if (statement->getE1()) {
        statement->getE1()->accept(this);
    }

    output << ";";

    if (statement->getE2()) {
        output << " ";
        statement->getE2()->accept(this);
    }

    output << ";";

    if (statement->getE3()) {
        output << " ";
        statement->getE3()->accept(this);
    }

    output << ":\n";

    indent();
    statement->getStatements()->accept(this);
    dedent();
}